

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_bitmap.cpp
# Opt level: O2

bool __thiscall ON_WindowsBitmap::WriteUncompressed(ON_WindowsBitmap *this,ON_BinaryArchive *file)

{
  ON_WindowsBITMAPINFO *pOVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  unsigned_short s;
  ON__INT32 i;
  unsigned_short s_00;
  uint i_00;
  long lVar5;
  uint local_4c;
  uint local_48;
  ON__INT32 local_44;
  ON__INT32 local_40;
  uint local_3c;
  
  pOVar1 = this->m_bmi;
  if (pOVar1 == (ON_WindowsBITMAPINFO *)0x0) {
    iVar4 = 0;
    s = 0;
    s_00 = 0;
    i_00 = 0;
    local_3c = 0;
    local_40 = 0;
    local_44 = 0;
    local_48 = 0;
    local_4c = 0;
    iVar3 = 0;
    i = 0;
  }
  else {
    iVar3 = (pOVar1->bmiHeader).biWidth;
    iVar4 = (pOVar1->bmiHeader).biHeight;
    s = (pOVar1->bmiHeader).biPlanes;
    s_00 = (pOVar1->bmiHeader).biBitCount;
    i_00 = (pOVar1->bmiHeader).biCompression;
    local_3c = (pOVar1->bmiHeader).biSizeImage;
    local_40 = (pOVar1->bmiHeader).biXPelsPerMeter;
    local_44 = (pOVar1->bmiHeader).biYPelsPerMeter;
    local_48 = (pOVar1->bmiHeader).biClrUsed;
    local_4c = (pOVar1->bmiHeader).biClrImportant;
    i = 0x28;
  }
  bVar2 = ON_BinaryArchive::WriteInt(file,i);
  if (((((((!bVar2) || (bVar2 = ON_BinaryArchive::WriteInt(file,iVar3), !bVar2)) ||
         (bVar2 = ON_BinaryArchive::WriteInt(file,iVar4), !bVar2)) ||
        ((bVar2 = ON_BinaryArchive::WriteShort(file,s), !bVar2 ||
         (bVar2 = ON_BinaryArchive::WriteShort(file,s_00), !bVar2)))) ||
       ((bVar2 = ON_BinaryArchive::WriteInt(file,i_00), !bVar2 ||
        ((bVar2 = ON_BinaryArchive::WriteInt(file,local_3c), !bVar2 ||
         (bVar2 = ON_BinaryArchive::WriteInt(file,local_40), !bVar2)))))) ||
      (bVar2 = ON_BinaryArchive::WriteInt(file,local_44), !bVar2)) ||
     ((bVar2 = ON_BinaryArchive::WriteInt(file,local_48), !bVar2 ||
      (bVar2 = ON_BinaryArchive::WriteInt(file,local_4c), !bVar2)))) {
    return false;
  }
  iVar3 = PaletteColorCount(this);
  bVar2 = true;
  lVar5 = 0;
  while ((lVar5 < iVar3 && (bVar2 != false))) {
    bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[lVar5].rgbBlue);
    if ((bVar2) &&
       ((bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[lVar5].rgbGreen), bVar2 &&
        (bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[lVar5].rgbRed), bVar2)))) {
      bVar2 = ON_BinaryArchive::WriteChar(file,this->m_bmi->bmiColors[lVar5].rgbReserved);
    }
    else {
      bVar2 = false;
    }
    lVar5 = lVar5 + 1;
  }
  iVar4 = (*(this->super_ON_Bitmap).super_ON_ModelComponent.super_ON_Object._vptr_ON_Object[0x1c])
                    (this);
  if ((~bVar2 & 1U) != 0 || CONCAT44(extraout_var,iVar4) == 0) {
    return bVar2;
  }
  bVar2 = ON_BinaryArchive::WriteByte
                    (file,CONCAT44(extraout_var,iVar4),this->m_bmi->bmiColors + iVar3);
  return bVar2;
}

Assistant:

bool ON_WindowsBitmap::WriteUncompressed( ON_BinaryArchive& file ) const
{
#if defined(ON_OS_WINDOWS_GDI)
  BITMAPINFOHEADER bmiHeader;
#else
  ON_WindowsBITMAPINFOHEADER bmiHeader;
#endif

  if ( m_bmi )
  {
    bmiHeader = m_bmi->bmiHeader;
    bmiHeader.biSize = sizeof(bmiHeader);
  }
  else 
  {
    memset(&bmiHeader,0,sizeof(bmiHeader));
  }
  int i;
  short s;
  i = bmiHeader.biSize;
  bool    rc = file.WriteInt(i);
  i = bmiHeader.biWidth;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biHeight;
  if (rc) rc = file.WriteInt(i);
  s = bmiHeader.biPlanes;
  if (rc) rc = file.WriteShort(s);
  s = bmiHeader.biBitCount;
  if (rc) rc = file.WriteShort(s);
  i = bmiHeader.biCompression;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biSizeImage;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biXPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biYPelsPerMeter;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrUsed;
  if (rc) rc = file.WriteInt(i);
  i = bmiHeader.biClrImportant;
  if (rc) rc = file.WriteInt(i);

  if ( rc ) 
  {
    const int color_count = PaletteColorCount();
    for (i = 0; i < color_count && rc; i++ )
    {
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbBlue );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbGreen );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbRed );
      if (rc) rc = file.WriteChar( m_bmi->bmiColors[i].rgbReserved );
    }
    const size_t sizeof_image = SizeofImage();
    if ( sizeof_image > 0 && rc ) 
    {
      if (rc) rc = file.WriteByte( sizeof_image, &m_bmi->bmiColors[color_count] );
    }
  }

  return rc;
}